

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addTargets.hpp
# Opt level: O3

bool helics::
     addTargets<helics::ValueFederate::registerValueInterfacesToml(std::__cxx11::string_const&)::__0>
               (value *section,string *targetName,anon_class_8_1_66e135f8 callback)

{
  pointer pbVar1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  array_type *paVar2;
  string_type *psVar3;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  __str;
  basic_value<toml::type_config> *target;
  pointer this;
  bool bVar4;
  string_view newTarget;
  string_view newTarget_00;
  string_view newTarget_01;
  string target_1;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> targets;
  value uval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  value *local_1c8;
  basic_value<toml::type_config> local_1c0;
  basic_value<toml::type_config> local_f8;
  
  toml::basic_value<toml::type_config>::basic_value(&local_f8);
  local_1c8 = section;
  v = toml::find_or<toml::type_config,std::__cxx11::string>
                (section,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         targetName,&local_f8);
  toml::basic_value<toml::type_config>::basic_value(&local_1c0,v);
  if (local_1c0.type_ == empty) {
    bVar4 = false;
  }
  else if (local_1c0.type_ == array) {
    paVar2 = toml::basic_value<toml::type_config>::as_array(&local_1c0);
    pbVar1 = (paVar2->
             super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    bVar4 = true;
    for (this = (paVar2->
                super__Vector_base<toml::basic_value<toml::type_config>,_std::allocator<toml::basic_value<toml::type_config>_>_>
                )._M_impl.super__Vector_impl_data._M_start; this != pbVar1; this = this + 1) {
      psVar3 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(this);
      v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
          psVar3->_M_string_length;
      newTarget._M_str = (psVar3->_M_dataplus)._M_p;
      newTarget._M_len = (size_t)v;
      Interface::addDestinationTarget(&(callback.pubObj)->super_Interface,newTarget,UNKNOWN);
    }
  }
  else {
    psVar3 = toml::basic_value<toml::type_config>::as_string_abi_cxx11_(&local_1c0);
    v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        psVar3->_M_string_length;
    bVar4 = true;
    newTarget_00._M_str = (psVar3->_M_dataplus)._M_p;
    newTarget_00._M_len = (size_t)v;
    Interface::addDestinationTarget(&(callback.pubObj)->super_Interface,newTarget_00,UNKNOWN);
  }
  if ((targetName->_M_dataplus)._M_p[targetName->_M_string_length - 1] == 's') {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (targetName);
    local_1e8._M_string_length = 0;
    local_1e8.field_2._M_local_buf[0] = '\0';
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    __str = toml::find_or<std::__cxx11::string,toml::type_config,std::__cxx11::string>
                      (local_1c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       targetName,&local_1e8);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1e8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
    v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        local_1e8._M_string_length;
    if ((enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
        local_1e8._M_string_length !=
        (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)0x0) {
      bVar4 = true;
      newTarget_01._M_str = local_1e8._M_dataplus._M_p;
      newTarget_01._M_len = local_1e8._M_string_length;
      Interface::addDestinationTarget(&(callback.pubObj)->super_Interface,newTarget_01,UNKNOWN);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
          (CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,local_1e8.field_2._M_local_buf[0])
          + 1);
      operator_delete(local_1e8._M_dataplus._M_p,(ulong)v);
    }
  }
  toml::basic_value<toml::type_config>::cleanup(&local_1c0,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1c0.comments_);
  toml::detail::region::~region(&local_1c0.region_);
  toml::basic_value<toml::type_config>::cleanup(&local_f8,(EVP_PKEY_CTX *)v);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_f8.comments_);
  toml::detail::region::~region(&local_f8.region_);
  return bVar4;
}

Assistant:

bool addTargets(const toml::value& section, std::string targetName, Callable callback)
{
    bool found{false};
    toml::value uval;
    // There should probably be a static_assert here but there isn't a nice type trait to check that
    auto targets = toml::find_or(section, targetName, uval);
    if (!targets.is_empty()) {
        if (targets.is_array()) {
            auto& targetArray = targets.as_array();
            for (const auto& target : targetArray) {
                callback(static_cast<const std::string&>(target.as_string()));
            }
        } else {
            callback(static_cast<const std::string&>(targets.as_string()));
        }
        found = true;
    }
    if (targetName.back() == 's') {
        targetName.pop_back();
        std::string target;
        target = toml::find_or(section, targetName, target);
        if (!target.empty()) {
            found = true;
            callback(target);
        }
    }
    return found;
}